

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall
CLI::detail::rjoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (string *__return_storage_ptr__,detail *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *v,string *delim)

{
  ulong uVar1;
  long lVar2;
  ostringstream s;
  ostringstream aoStack_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  if (*(long *)(this + 8) != *(long *)this) {
    lVar2 = -0x20;
    uVar1 = 0;
    do {
      if (uVar1 != 0) {
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)aoStack_1a8,
                   (char *)(v->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                   (long)(v->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)aoStack_1a8,*(char **)(*(long *)(this + 8) + lVar2),
                 *(long *)(*(long *)(this + 8) + 8 + lVar2));
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + -0x20;
    } while (uVar1 < (ulong)(*(long *)(this + 8) - *(long *)this >> 5));
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string rjoin(const T &v, std::string delim = ",") {
    std::ostringstream s;
    for(std::size_t start = 0; start < v.size(); start++) {
        if(start > 0)
            s << delim;
        s << v[v.size() - start - 1];
    }
    return s.str();
}